

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,int>(BaseAppender *this,Vector *col,long input)

{
  int iVar1;
  int *piVar2;
  idx_t iVar3;
  long in_RDI;
  long unaff_retaddr;
  
  iVar1 = Cast::Operation<long,int>(unaff_retaddr);
  piVar2 = FlatVector::GetData<int>((Vector *)0x93e6c5);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  piVar2[iVar3] = iVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}